

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O0

bool INTERACTIONS::must_be_left_sorted(string *oi)

{
  bool bVar1;
  ulong uVar2;
  reference pcVar3;
  const_iterator i;
  bool pair_found;
  bool diff_ns_found;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  byte local_12;
  byte local_11;
  bool local_1;
  
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < 2) {
    local_1 = true;
  }
  else {
    local_11 = 0;
    local_12 = 0;
    local_20._M_current = (char *)std::begin<std::__cxx11::string>(in_stack_ffffffffffffffb8);
    while( true ) {
      std::end<std::__cxx11::string>(in_stack_ffffffffffffffb8);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator-((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_ffffffffffffffc8._M_current,
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffffb8);
      if (!bVar1) break;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      in_stack_ffffffffffffffc4 = (int)*pcVar3;
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator+(in_stack_ffffffffffffffc8._M_current,
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&stack0xffffffffffffffc8);
      if (in_stack_ffffffffffffffc4 == *pcVar3) {
        if ((local_11 & 1) != 0) {
          return true;
        }
        local_12 = 1;
      }
      else {
        if ((local_12 & 1) != 0) {
          return true;
        }
        local_11 = 1;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_20);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool must_be_left_sorted(const std::string& oi)
{
  if (oi.size() <= 1)
    return true;  // one letter in string - no need to sort

  bool diff_ns_found = false;
  bool pair_found = false;

  for (auto i = std::begin(oi); i != std::end(oi) - 1; ++i)
    if (*i == *(i + 1))  // pair found
    {
      if (diff_ns_found)
        return true;  // case 'abb'
      pair_found = true;
    }
    else
    {
      if (pair_found)
        return true;  // case 'aab'
      diff_ns_found = true;
    }

  return false;  // 'aaa' or 'abc'
}